

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CalcTangentsProcess.cpp
# Opt level: O2

bool __thiscall
Assimp::CalcTangentsProcess::ProcessMesh(CalcTangentsProcess *this,aiMesh *pMesh,uint meshIndex)

{
  aiFace *paVar1;
  aiVector3t<float> *v;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  uint uVar12;
  uint uVar13;
  aiVector3D *paVar14;
  aiVector3D *paVar15;
  aiVector3D *paVar16;
  uint *puVar17;
  SharedPostProcessInfo *this_00;
  aiVector3D *paVar18;
  aiVector3D *paVar19;
  bool bVar20;
  aiVector3D *__s;
  aiVector3D *__s_00;
  Logger *pLVar21;
  bool bVar22;
  ulong __n;
  ulong uVar23;
  SpatialSort *this_01;
  uint i;
  ulong uVar24;
  uint uVar25;
  ai_real pRadius;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  reference rVar34;
  aiVector3t<float> aVar35;
  aiVector3t<float> aVar36;
  uint idx;
  float fStack_2b4;
  float local_2b0;
  uint local_2ac;
  vector<unsigned_int,_std::allocator<unsigned_int>_> verticesFound;
  aiVector3t<float> local_280;
  SpatialSort _vertexFinder;
  float local_248;
  float fStack_244;
  SpatialSort *local_238;
  vector<unsigned_int,_std::allocator<unsigned_int>_> closeVertices;
  vector<bool,_std::allocator<bool>_> vertexDone;
  
  if (pMesh->mTangents == (aiVector3D *)0x0) {
    if ((pMesh->mPrimitiveTypes & 0xc) == 0) {
      pLVar21 = DefaultLogger::get();
      Logger::info(pLVar21,"Tangents are undefined for line and point meshes");
    }
    else if (pMesh->mNormals == (aiVector3D *)0x0) {
      pLVar21 = DefaultLogger::get();
      Logger::error(pLVar21,"Failed to compute tangents; need normals");
    }
    else {
      if (((ulong)this->configSourceUV < 8) &&
         (pMesh->mTextureCoords[this->configSourceUV] != (aiVector3D *)0x0)) {
        _vertexFinder.mPlaneNormal._0_8_ = _vertexFinder.mPlaneNormal._0_8_ & 0xffffffffffffff00;
        std::vector<bool,_std::allocator<bool>_>::vector
                  (&vertexDone,(ulong)pMesh->mNumVertices,(bool *)&_vertexFinder,
                   (allocator_type *)&verticesFound);
        uVar25 = pMesh->mNumVertices;
        uVar23 = (ulong)uVar25 * 0xc;
        __s = (aiVector3D *)operator_new__(uVar23);
        if (uVar25 != 0) {
          memset(__s,0,((uVar23 - 0xc) - (uVar23 - 0xc) % 0xc) + 0xc);
        }
        pMesh->mTangents = __s;
        __s_00 = (aiVector3D *)operator_new__(uVar23);
        if (uVar25 != 0) {
          memset(__s_00,0,((uVar23 - 0xc) - (uVar23 - 0xc) % 0xc) + 0xc);
        }
        pMesh->mBitangents = __s_00;
        paVar14 = pMesh->mVertices;
        paVar15 = pMesh->mNormals;
        paVar16 = pMesh->mTextureCoords[this->configSourceUV];
        for (uVar23 = 0; uVar23 < pMesh->mNumFaces; uVar23 = uVar23 + 1) {
          paVar1 = pMesh->mFaces + uVar23;
          uVar25 = pMesh->mFaces[uVar23].mNumIndices;
          if (uVar25 < 3) {
            for (uVar24 = 0; uVar24 < uVar25; uVar24 = uVar24 + 1) {
              __n = (ulong)paVar1->mIndices[uVar24];
              rVar34 = std::vector<bool,_std::allocator<bool>_>::operator[](&vertexDone,__n);
              *rVar34._M_p = *rVar34._M_p | rVar34._M_mask;
              __s[__n].x = NAN;
              __s[__n].y = NAN;
              __s[__n].z = NAN;
              __s_00[__n].x = NAN;
              __s_00[__n].y = NAN;
              __s_00[__n].z = NAN;
              uVar25 = paVar1->mNumIndices;
            }
          }
          else {
            puVar17 = paVar1->mIndices;
            uVar25 = *puVar17;
            uVar12 = puVar17[1];
            uVar13 = puVar17[2];
            aVar35 = operator-(paVar14 + uVar12,paVar14 + uVar25);
            aVar36 = operator-(paVar14 + uVar13,paVar14 + uVar25);
            uVar2 = paVar16[uVar25].x;
            uVar7 = paVar16[uVar25].y;
            uVar3 = paVar16[uVar13].x;
            uVar8 = paVar16[uVar13].y;
            uVar4 = paVar16[uVar12].x;
            uVar9 = paVar16[uVar12].y;
            fVar28 = (float)uVar3 - (float)uVar2;
            fVar29 = (float)uVar8 - (float)uVar7;
            fVar30 = (float)uVar4 - (float)uVar2;
            fVar31 = (float)uVar9 - (float)uVar7;
            fVar27 = fVar29 * fVar30;
            fVar26 = fVar31 * fVar28;
            if ((fVar27 == fVar28 * fVar31) && (!NAN(fVar27) && !NAN(fVar28 * fVar31))) {
              fVar28 = 1.0;
              fVar29 = 0.0;
              fVar30 = 0.0;
              fVar31 = 1.0;
            }
            fVar26 = *(float *)(&DAT_0068e720 + (ulong)(fVar26 - fVar27 < 0.0) * 4);
            fVar33 = (aVar36.z * fVar31 - fVar29 * aVar35.z) * fVar26;
            local_248 = aVar35.x;
            fStack_244 = aVar35.y;
            fVar27 = (fVar30 * aVar36.z - aVar35.z * fVar28) * fVar26;
            fVar32 = (fVar31 * aVar36.x - fVar29 * local_248) * fVar26;
            fVar31 = (fVar31 * aVar36.y - fVar29 * fStack_244) * fVar26;
            fVar29 = (fVar30 * aVar36.x - fVar28 * local_248) * fVar26;
            fVar26 = (fVar30 * aVar36.y - fVar28 * fStack_244) * fVar26;
            for (uVar24 = 0; uVar24 < paVar1->mNumIndices; uVar24 = uVar24 + 1) {
              uVar25 = paVar1->mIndices[uVar24];
              v = paVar15 + uVar25;
              aVar35 = ::operator*(v,paVar15[uVar25].z * fVar33 +
                                     paVar15[uVar25].x * fVar32 + paVar15[uVar25].y * fVar31);
              _vertexFinder.mPlaneNormal.x = fVar32 - aVar35.x;
              _vertexFinder.mPlaneNormal.y = fVar31 - aVar35.y;
              _vertexFinder.mPlaneNormal.z = fVar33 - aVar35.z;
              aVar35 = ::operator*(v,v->z * fVar27 + v->x * fVar29 + v->y * fVar26);
              verticesFound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(fVar26 - aVar35.y,fVar29 - aVar35.x);
              verticesFound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)CONCAT44(verticesFound.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     fVar27 - aVar35.z);
              aiVector3t<float>::NormalizeSafe(&_vertexFinder.mPlaneNormal);
              aiVector3t<float>::NormalizeSafe((aiVector3t<float> *)&verticesFound);
              bVar20 = true;
              if (((uint)ABS(_vertexFinder.mPlaneNormal.x) < 0x7f800000) &&
                 ((uint)ABS(_vertexFinder.mPlaneNormal.y) < 0x7f800000)) {
                bVar20 = 0x7f7fffff < (uint)ABS(_vertexFinder.mPlaneNormal.z);
              }
              bVar22 = true;
              if ((((uint)verticesFound.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start & 0x7fffffff) < 0x7f800000) &&
                 ((verticesFound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start._4_4_ & 0x7fffffff) < 0x7f800000)) {
                bVar22 = 0x7f7fffff <
                         ((uint)verticesFound.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish._0_4_ & 0x7fffffff);
              }
              if (bVar22 != bVar20) {
                if (bVar20 == false) {
                  aVar35 = operator^(&_vertexFinder.mPlaneNormal,v);
                  verticesFound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start = aVar35._0_8_;
                  verticesFound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish =
                       (pointer)CONCAT44(verticesFound.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish._4_4_,aVar35.z);
                  this_01 = (SpatialSort *)&verticesFound;
                }
                else {
                  aVar35 = operator^(v,(aiVector3t<float> *)&verticesFound);
                  _vertexFinder.mPlaneNormal.z = aVar35.z;
                  _vertexFinder.mPlaneNormal._0_8_ = aVar35._0_8_;
                  this_01 = &_vertexFinder;
                }
                aiVector3t<float>::NormalizeSafe(&this_01->mPlaneNormal);
              }
              __s[uVar25].z = _vertexFinder.mPlaneNormal.z;
              __s[uVar25].x = _vertexFinder.mPlaneNormal.x;
              __s[uVar25].y = _vertexFinder.mPlaneNormal.y;
              __s_00[uVar25].z =
                   verticesFound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish._0_4_;
              *(pointer *)(__s_00 + uVar25) =
                   verticesFound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
            }
          }
        }
        SpatialSort::SpatialSort(&_vertexFinder);
        this_00 = (this->super_BaseProcess).shared;
        if ((this_00 == (SharedPostProcessInfo *)0x0) ||
           (SharedPostProcessInfo::
            GetProperty<std::vector<std::pair<Assimp::SpatialSort,float>,std::allocator<std::pair<Assimp::SpatialSort,float>>>>
                      (this_00,"$Spat",
                       (vector<std::pair<Assimp::SpatialSort,_float>,_std::allocator<std::pair<Assimp::SpatialSort,_float>_>_>
                        **)&verticesFound),
           verticesFound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start == (pointer)0x0)) {
          local_238 = &_vertexFinder;
          SpatialSort::Fill(local_238,pMesh->mVertices,pMesh->mNumVertices,0xc,true);
          pRadius = ComputePositionEpsilon(pMesh);
        }
        else {
          local_238 = (SpatialSort *)
                      (*(long *)verticesFound.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start + (ulong)meshIndex * 0x30);
          pRadius = *(ai_real *)
                     (*(long *)verticesFound.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + 0x28 +
                     (ulong)meshIndex * 0x30);
        }
        verticesFound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        verticesFound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        verticesFound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        fVar28 = cosf(this->configMaxAngle);
        closeVertices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        closeVertices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        closeVertices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        for (local_2ac = 0; local_2ac < pMesh->mNumVertices; local_2ac = local_2ac + 1) {
          rVar34 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (&vertexDone,(ulong)local_2ac);
          if ((*rVar34._M_p & rVar34._M_mask) == 0) {
            paVar14 = pMesh->mVertices;
            uVar23 = (ulong)local_2ac;
            paVar16 = pMesh->mNormals;
            paVar18 = pMesh->mTangents;
            paVar19 = pMesh->mBitangents;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&closeVertices,0);
            SpatialSort::FindPositions(local_238,paVar14 + uVar23,pRadius,&verticesFound);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                      (&closeVertices,
                       ((long)verticesFound.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)verticesFound.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2) + 5);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      (&closeVertices,&local_2ac);
            for (uVar25 = 0;
                (ulong)uVar25 <
                (ulong)((long)verticesFound.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)verticesFound.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2); uVar25 = uVar25 + 1) {
              _idx = CONCAT44(fStack_2b4,
                              verticesFound.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar25]);
              rVar34 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 (&vertexDone,
                                  (ulong)verticesFound.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start[uVar25]);
              if (((((*rVar34._M_p & rVar34._M_mask) == 0) &&
                   (fVar29 = ::operator*(paVar15 + (_idx & 0xffffffff),paVar16 + uVar23),
                   0.9999 <= fVar29)) &&
                  (fVar29 = ::operator*(__s + (_idx & 0xffffffff),paVar18 + uVar23),
                  fVar28 <= fVar29)) &&
                 (fVar29 = ::operator*(__s_00 + (_idx & 0xffffffff),paVar19 + uVar23),
                 fVar28 <= fVar29)) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                          (&closeVertices,&idx);
                rVar34 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                   (&vertexDone,_idx & 0xffffffff);
                *rVar34._M_p = *rVar34._M_p | rVar34._M_mask;
              }
            }
            _idx = 0;
            local_2b0 = 0.0;
            local_280.x = 0.0;
            local_280.y = 0.0;
            local_280.z = 0.0;
            fVar29 = 0.0;
            fVar30 = 0.0;
            for (uVar25 = 0; uVar23 = (ulong)uVar25,
                uVar23 < (ulong)((long)closeVertices.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)closeVertices.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 2);
                uVar25 = uVar25 + 1) {
              uVar5 = __s[closeVertices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar23]].x;
              uVar10 = __s[closeVertices.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar23]].y;
              fVar29 = fVar29 + (float)uVar5;
              fVar30 = fVar30 + (float)uVar10;
              _idx = CONCAT44(fVar30,fVar29);
              local_2b0 = local_2b0 +
                          __s[closeVertices.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar23]].z;
              uVar6 = __s_00[closeVertices.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[uVar23]].x;
              uVar11 = __s_00[closeVertices.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar23]].y;
              fVar31 = local_280.y;
              local_280.x = local_280.x + (float)uVar6;
              local_280.y = fVar31 + (float)uVar11;
              local_280.z = local_280.z +
                            __s_00[closeVertices.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[uVar23]].z;
            }
            aiVector3t<float>::Normalize((aiVector3t<float> *)&idx);
            aiVector3t<float>::Normalize(&local_280);
            for (uVar25 = 0; uVar23 = (ulong)uVar25,
                uVar23 < (ulong)((long)closeVertices.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)closeVertices.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 2);
                uVar25 = uVar25 + 1) {
              uVar12 = closeVertices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar23];
              __s[uVar12].z = local_2b0;
              __s[uVar12].x = (float)idx;
              __s[uVar12].y = fStack_2b4;
              uVar12 = closeVertices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar23];
              __s_00[uVar12].x = local_280.x;
              __s_00[uVar12].y = local_280.y;
              __s_00[uVar12].z = local_280.z;
            }
          }
        }
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&closeVertices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&verticesFound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        SpatialSort::~SpatialSort(&_vertexFinder);
        std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                  (&vertexDone.super__Bvector_base<std::allocator<bool>_>);
        return true;
      }
      pLVar21 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[52]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&vertexDone
                 ,(char (*) [52])"Failed to compute tangents; need UV data in channel");
      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&vertexDone,
                 &this->configSourceUV);
      std::__cxx11::stringbuf::str();
      Logger::error(pLVar21,(char *)_vertexFinder.mPlaneNormal._0_8_);
      std::__cxx11::string::~string((string *)&_vertexFinder);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vertexDone);
    }
  }
  return false;
}

Assistant:

bool CalcTangentsProcess::ProcessMesh( aiMesh* pMesh, unsigned int meshIndex)
{
    // we assume that the mesh is still in the verbose vertex format where each face has its own set
    // of vertices and no vertices are shared between faces. Sadly I don't know any quick test to
    // assert() it here.
    // assert( must be verbose, dammit);

    if (pMesh->mTangents) // this implies that mBitangents is also there
        return false;

    // If the mesh consists of lines and/or points but not of
    // triangles or higher-order polygons the normal vectors
    // are undefined.
    if (!(pMesh->mPrimitiveTypes & (aiPrimitiveType_TRIANGLE | aiPrimitiveType_POLYGON)))
    {
        ASSIMP_LOG_INFO("Tangents are undefined for line and point meshes");
        return false;
    }

    // what we can check, though, is if the mesh has normals and texture coordinates. That's a requirement
    if( pMesh->mNormals == NULL)
    {
        ASSIMP_LOG_ERROR("Failed to compute tangents; need normals");
        return false;
    }
    if( configSourceUV >= AI_MAX_NUMBER_OF_TEXTURECOORDS || !pMesh->mTextureCoords[configSourceUV] )
    {
        ASSIMP_LOG_ERROR((Formatter::format("Failed to compute tangents; need UV data in channel"),configSourceUV));
        return false;
    }

    const float angleEpsilon = 0.9999f;

    std::vector<bool> vertexDone( pMesh->mNumVertices, false);
    const float qnan = get_qnan();

    // create space for the tangents and bitangents
    pMesh->mTangents = new aiVector3D[pMesh->mNumVertices];
    pMesh->mBitangents = new aiVector3D[pMesh->mNumVertices];

    const aiVector3D* meshPos = pMesh->mVertices;
    const aiVector3D* meshNorm = pMesh->mNormals;
    const aiVector3D* meshTex = pMesh->mTextureCoords[configSourceUV];
    aiVector3D* meshTang = pMesh->mTangents;
    aiVector3D* meshBitang = pMesh->mBitangents;

    // calculate the tangent and bitangent for every face
    for( unsigned int a = 0; a < pMesh->mNumFaces; a++)
    {
        const aiFace& face = pMesh->mFaces[a];
        if (face.mNumIndices < 3)
        {
            // There are less than three indices, thus the tangent vector
            // is not defined. We are finished with these vertices now,
            // their tangent vectors are set to qnan.
            for (unsigned int i = 0; i < face.mNumIndices;++i)
            {
                unsigned int idx = face.mIndices[i];
                vertexDone  [idx] = true;
                meshTang    [idx] = aiVector3D(qnan);
                meshBitang  [idx] = aiVector3D(qnan);
            }

            continue;
        }

        // triangle or polygon... we always use only the first three indices. A polygon
        // is supposed to be planar anyways....
        // FIXME: (thom) create correct calculation for multi-vertex polygons maybe?
        const unsigned int p0 = face.mIndices[0], p1 = face.mIndices[1], p2 = face.mIndices[2];

        // position differences p1->p2 and p1->p3
        aiVector3D v = meshPos[p1] - meshPos[p0], w = meshPos[p2] - meshPos[p0];

        // texture offset p1->p2 and p1->p3
        float sx = meshTex[p1].x - meshTex[p0].x, sy = meshTex[p1].y - meshTex[p0].y;
        float tx = meshTex[p2].x - meshTex[p0].x, ty = meshTex[p2].y - meshTex[p0].y;
        float dirCorrection = (tx * sy - ty * sx) < 0.0f ? -1.0f : 1.0f;
        // when t1, t2, t3 in same position in UV space, just use default UV direction.
        if (  sx * ty == sy * tx ) {
            sx = 0.0; sy = 1.0;
            tx = 1.0; ty = 0.0;
        }

        // tangent points in the direction where to positive X axis of the texture coord's would point in model space
        // bitangent's points along the positive Y axis of the texture coord's, respectively
        aiVector3D tangent, bitangent;
        tangent.x = (w.x * sy - v.x * ty) * dirCorrection;
        tangent.y = (w.y * sy - v.y * ty) * dirCorrection;
        tangent.z = (w.z * sy - v.z * ty) * dirCorrection;
        bitangent.x = (w.x * sx - v.x * tx) * dirCorrection;
        bitangent.y = (w.y * sx - v.y * tx) * dirCorrection;
        bitangent.z = (w.z * sx - v.z * tx) * dirCorrection;

        // store for every vertex of that face
        for( unsigned int b = 0; b < face.mNumIndices; ++b ) {
            unsigned int p = face.mIndices[b];

            // project tangent and bitangent into the plane formed by the vertex' normal
            aiVector3D localTangent = tangent - meshNorm[p] * (tangent * meshNorm[p]);
            aiVector3D localBitangent = bitangent - meshNorm[p] * (bitangent * meshNorm[p]);
            localTangent.NormalizeSafe(); localBitangent.NormalizeSafe();

            // reconstruct tangent/bitangent according to normal and bitangent/tangent when it's infinite or NaN.
            bool invalid_tangent = is_special_float(localTangent.x) || is_special_float(localTangent.y) || is_special_float(localTangent.z);
            bool invalid_bitangent = is_special_float(localBitangent.x) || is_special_float(localBitangent.y) || is_special_float(localBitangent.z);
            if (invalid_tangent != invalid_bitangent) {
                if (invalid_tangent) {
                    localTangent = meshNorm[p] ^ localBitangent;
                    localTangent.NormalizeSafe();
                } else {
                    localBitangent = localTangent ^ meshNorm[p];
                    localBitangent.NormalizeSafe();
                }
            }

            // and write it into the mesh.
            meshTang[ p ]   = localTangent;
            meshBitang[ p ] = localBitangent;
        }
    }


    // create a helper to quickly find locally close vertices among the vertex array
    // FIX: check whether we can reuse the SpatialSort of a previous step
    SpatialSort* vertexFinder = NULL;
    SpatialSort  _vertexFinder;
    float posEpsilon;
    if (shared)
    {
        std::vector<std::pair<SpatialSort,float> >* avf;
        shared->GetProperty(AI_SPP_SPATIAL_SORT,avf);
        if (avf)
        {
            std::pair<SpatialSort,float>& blubb = avf->operator [] (meshIndex);
            vertexFinder = &blubb.first;
            posEpsilon = blubb.second;;
        }
    }
    if (!vertexFinder)
    {
        _vertexFinder.Fill(pMesh->mVertices, pMesh->mNumVertices, sizeof( aiVector3D));
        vertexFinder = &_vertexFinder;
        posEpsilon = ComputePositionEpsilon(pMesh);
    }
    std::vector<unsigned int> verticesFound;

    const float fLimit = std::cos(configMaxAngle);
    std::vector<unsigned int> closeVertices;

    // in the second pass we now smooth out all tangents and bitangents at the same local position
    // if they are not too far off.
    for( unsigned int a = 0; a < pMesh->mNumVertices; a++)
    {
        if( vertexDone[a])
            continue;

        const aiVector3D& origPos = pMesh->mVertices[a];
        const aiVector3D& origNorm = pMesh->mNormals[a];
        const aiVector3D& origTang = pMesh->mTangents[a];
        const aiVector3D& origBitang = pMesh->mBitangents[a];
        closeVertices.resize( 0 );

        // find all vertices close to that position
        vertexFinder->FindPositions( origPos, posEpsilon, verticesFound);

        closeVertices.reserve (verticesFound.size()+5);
        closeVertices.push_back( a);

        // look among them for other vertices sharing the same normal and a close-enough tangent/bitangent
        for( unsigned int b = 0; b < verticesFound.size(); b++)
        {
            unsigned int idx = verticesFound[b];
            if( vertexDone[idx])
                continue;
            if( meshNorm[idx] * origNorm < angleEpsilon)
                continue;
            if(  meshTang[idx] * origTang < fLimit)
                continue;
            if( meshBitang[idx] * origBitang < fLimit)
                continue;

            // it's similar enough -> add it to the smoothing group
            closeVertices.push_back( idx);
            vertexDone[idx] = true;
        }

        // smooth the tangents and bitangents of all vertices that were found to be close enough
        aiVector3D smoothTangent( 0, 0, 0), smoothBitangent( 0, 0, 0);
        for( unsigned int b = 0; b < closeVertices.size(); ++b)
        {
            smoothTangent += meshTang[ closeVertices[b] ];
            smoothBitangent += meshBitang[ closeVertices[b] ];
        }
        smoothTangent.Normalize();
        smoothBitangent.Normalize();

        // and write it back into all affected tangents
        for( unsigned int b = 0; b < closeVertices.size(); ++b)
        {
            meshTang[ closeVertices[b] ] = smoothTangent;
            meshBitang[ closeVertices[b] ] = smoothBitangent;
        }
    }
    return true;
}